

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckFrameSet(TidyDocImpl *doc,Node *node)

{
  tmbchar *ptVar1;
  long lVar2;
  uint uVar3;
  Node *pNVar4;
  Node *node_00;
  Lexer *pLVar5;
  bool bVar6;
  Bool BVar7;
  ctmbstr __haystack;
  char *pcVar8;
  ulong uVar9;
  tmbstr txt;
  ctmbstr cp;
  tmbchar *ptVar10;
  Node *para;
  Node *node_01;
  
  if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) {
    return;
  }
  if ((doc->badAccess & 0x40) != 0) {
    prvTidyReportAccessError(doc,node,0x2de);
    *(byte *)&doc->badAccess = (byte)doc->badAccess & 0xbf;
  }
  node_01 = node->content;
  if (node_01 != (Node *)0x0) {
    ptVar1 = (doc->access).text;
    bVar6 = false;
    do {
      if ((node_01->tag != (Dict *)0x0) && (node_01->tag->id == TidyTag_NOFRAMES)) {
        pNVar4 = node_01->content;
        if (pNVar4 == (Node *)0x0) {
LAB_0015516d:
          prvTidyReportAccessError(doc,node_01,0x2dc);
        }
        else {
          node_00 = pNVar4->content;
          if (((node_00 != (Node *)0x0) && (node_00->tag != (Dict *)0x0)) &&
             (node_00->tag->id == TidyTag_P)) {
            BVar7 = prvTidynodeIsText(node_00->content);
            bVar6 = true;
            if (BVar7 != no) {
              __haystack = textFromOneNode(doc,node_00->content);
              pcVar8 = strstr(__haystack,"browser");
              if (pcVar8 != (char *)0x0) {
                prvTidyReportAccessError(doc,node_00,0x2dd);
              }
            }
            goto LAB_00155183;
          }
          uVar3 = pNVar4->start;
          if (uVar3 < pNVar4->end) {
            pLVar5 = doc->lexer;
            uVar9 = 0;
            do {
              ptVar1[uVar9] = pLVar5->lexbuf[uVar9 + uVar3];
              if (uVar9 == 0x7f) {
                uVar9 = 0x7f;
                break;
              }
              lVar2 = uVar3 + uVar9;
              uVar9 = uVar9 + 1;
            } while (lVar2 + 1U < (ulong)pNVar4->end);
            uVar9 = uVar9 & 0xffffffff;
          }
          else {
            uVar9 = 0;
          }
          ptVar1[uVar9] = '\0';
          ptVar10 = ptVar1;
          do {
            if (*ptVar10 == '\0') goto LAB_0015516d;
            BVar7 = prvTidyIsWhite((int)*ptVar10);
            ptVar10 = ptVar10 + 1;
          } while (BVar7 != no);
        }
        bVar6 = true;
      }
LAB_00155183:
      node_01 = node_01->next;
    } while (node_01 != (Node *)0x0);
    if (bVar6) {
      return;
    }
  }
  prvTidyReportAccessError(doc,node,0x2db);
  return;
}

Assistant:

static void CheckFrameSet( TidyDocImpl* doc, Node* node )
{
    Node* temp;
    Bool HasNoFrames = no;

    if (Level1_Enabled( doc ))
    {
        if ( doc->badAccess & BA_INVALID_LINK_NOFRAMES )
        {
           TY_(ReportAccessError)( doc, node, NOFRAMES_INVALID_LINK);
           doc->badAccess &= ~BA_INVALID_LINK_NOFRAMES; /* emit only once */
        }
        for ( temp = node->content; temp != NULL ; temp = temp->next )
        {
            if ( nodeIsNOFRAMES(temp) )
            {
                HasNoFrames = yes;

                if ( temp->content && nodeIsP(temp->content->content) )
                {
                    Node* para = temp->content->content;
                    if ( TY_(nodeIsText)(para->content) )
                    {
                        ctmbstr word = textFromOneNode( doc, para->content );
                        if ( word && strstr(word, "browser") != NULL )
                            TY_(ReportAccessError)( doc, para, NOFRAMES_INVALID_CONTENT );
                    }
                }
                else if (temp->content == NULL)
                    TY_(ReportAccessError)( doc, temp, NOFRAMES_INVALID_NO_VALUE);
                else if ( temp->content &&
                          IsWhitespace(textFromOneNode(doc, temp->content)) )
                    TY_(ReportAccessError)( doc, temp, NOFRAMES_INVALID_NO_VALUE);
            }
        }

        if (HasNoFrames == no)
            TY_(ReportAccessError)( doc, node, FRAME_MISSING_NOFRAMES);
    }
}